

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::
CordOutputStreamTest_CapsSizeAtHintButUsesCapacityBeyondHint_Test::TestBody
          (CordOutputStreamTest_CapsSizeAtHintButUsesCapacityBeyondHint_Test *this)

{
  bool bVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  int size;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  Cord cord;
  void *data;
  size_t size_hint;
  CordOutputStream output;
  int local_15c;
  undefined1 local_158 [8];
  AssertHelperData *pAStack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [2];
  string local_120;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  AssertHelper local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  undefined1 local_c0 [16];
  internal local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  unsigned_long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  CordOutputStream local_50;
  
  local_88 = 0x11;
  CordOutputStream::CordOutputStream(&local_50,0x11);
  bVar1 = CordOutputStream::Next(&local_50,(void **)(local_98 + 8),&local_15c);
  local_100[0] = bVar1;
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_100,
               (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x50d,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    if (!bVar1) goto LAB_00b635ae;
  }
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_158,"size","size_hint",&local_15c,&local_88);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (pAStack_150 == (AssertHelperData *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)pAStack_150;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x50e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if (local_100 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
    if (pAStack_150 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_150)
      ;
    }
    goto LAB_00b635ae;
  }
  if (pAStack_150 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pAStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_150);
  }
  memset((void *)local_98._8_8_,0x61,(long)local_15c);
  bVar1 = CordOutputStream::Next(&local_50,(void **)(local_98 + 8),&local_15c);
  local_100[0] = bVar1;
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_100,
               (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x511,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    if (!bVar1) goto LAB_00b635ae;
  }
  memset((void *)local_98._8_8_,0x62,(long)local_15c);
  CordOutputStream::Consume((CordOutputStream *)local_a0);
  bVar1 = true;
  if ((Nonnull<CordRep_*>)local_98._0_8_ != (Nonnull<CordRep_*>)0x0 && (local_a0[0] & 1) != 0) {
    local_158 = (undefined1  [8])0x0;
    pAStack_150 = (AssertHelperData *)0x0;
    bVar1 = absl::lts_20250127::Cord::GetFlatAux
                      ((Nonnull<CordRep_*>)local_98._0_8_,(Nonnull<absl::string_view_*>)local_158);
  }
  local_100[0] = bVar1;
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == false) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_f8;
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_100,(AssertionResult *)"cord.TryFlat()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x516,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
    local_a8._M_p = (pointer)local_f8;
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b6359c;
  }
  else {
    if ((Nonnull<CordRep_*>)local_98._0_8_ == (Nonnull<CordRep_*>)0x0 ||
        ((long)(char)local_a0[0] & 1U) == 0) {
      if ((local_a0[0] & 1) == 0) {
        local_60._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((ulong)(long)(char)local_a0[0] >> 1);
        local_60._8_8_ = (AssertHelperData *)(local_a0 + 1);
      }
      else {
        local_60._M_allocated_capacity =
             (size_type)
             *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_98._0_8_;
        local_60._8_8_ = (AssertHelperData *)0x0;
      }
    }
    else {
      local_158 = (undefined1  [8])0x0;
      pAStack_150 = (AssertHelperData *)0x0;
      absl::lts_20250127::Cord::GetFlatAux
                ((Nonnull<CordRep_*>)local_98._0_8_,(Nonnull<absl::string_view_*>)local_158);
      local_60._M_allocated_capacity = (size_type)local_158;
      local_60._8_8_ = pAStack_150;
    }
    local_d0.data_ = (AssertHelperData *)local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)local_88);
    local_158 = (undefined1  [8])local_c8;
    pAStack_150 = local_d0.data_;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8);
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)local_15c);
    local_100 = (undefined1  [8])local_78._0_8_;
    local_f8 = local_80;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_120,(lts_20250127 *)local_158,(AlphaNum *)local_100,(AlphaNum *)local_78._0_8_
              );
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (local_b0,"flat",
               "absl::StrCat(std::string(size_hint, \'a\'), std::string(static_cast<size_t>(size), \'b\'))"
               ,(basic_string_view<char,_std::char_traits<char>_> *)&local_60,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_80 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8)) {
      operator_delete(local_80,local_78._8_8_ + 1);
    }
    if (local_d0.data_ != (AssertHelperData *)local_c0) {
      operator_delete(local_d0.data_,local_c0._0_8_ + 1);
    }
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_158);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._M_p ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = *(char **)local_a8._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x519,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_100,(Message *)local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_100);
      if (local_158 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_158 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a8;
LAB_00b6359c:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8._M_p);
    }
  }
  absl::lts_20250127::Cord::~Cord((Cord *)local_a0);
LAB_00b635ae:
  if ((local_50.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_50.buffer_.rep_.field_0._1_7_,
                        local_50.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_50.cord_);
  return;
}

Assistant:

TEST(CordOutputStreamTest, CapsSizeAtHintButUsesCapacityBeyondHint) {
  // This tests verifies that when we provide a hint of 'x' bytes, that the
  // returned size from Next() will be capped at 'size_hint', but that if we
  // exceed size_hint, it will use the capacity in any internal buffer beyond
  // the size hint. We test this by providing a hint that is too large to be
  // inlined, but so small that we have a guarantee it's smaller than the
  // minimum flat size so we will have a 'capped' larger buffer as state.
  size_t size_hint = sizeof(absl::Cord) + 1;
  CordOutputStream output(size_hint);
  void* data;
  int size;

  ASSERT_TRUE(output.Next(&data, &size));
  ASSERT_EQ(size, size_hint);
  memset(data, 'a', static_cast<size_t>(size));

  ASSERT_TRUE(output.Next(&data, &size));
  memset(data, 'b', static_cast<size_t>(size));

  // We should have received the same buffer on each Next() call
  absl::Cord cord = output.Consume();
  ASSERT_TRUE(cord.TryFlat());
  absl::string_view flat = *cord.TryFlat();
  EXPECT_EQ(flat, absl::StrCat(std::string(size_hint, 'a'),
                               std::string(static_cast<size_t>(size), 'b')));
}